

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_cross_entropy_loss(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  
  _Var1 = ggml_are_same_shape(a,b);
  if (_Var1) {
    pgVar2 = ggml_new_tensor_1d(ctx,a->type,1);
    pgVar2->op = GGML_OP_CROSS_ENTROPY_LOSS;
    pgVar2->src[0] = a;
    pgVar2->src[1] = b;
    return pgVar2;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0x13eb,
             "GGML_ASSERT(%s) failed","ggml_are_same_shape(a, b)");
}

Assistant:

struct ggml_tensor * ggml_cross_entropy_loss(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b) {
    GGML_ASSERT(ggml_are_same_shape(a, b));

    struct ggml_tensor * result = ggml_new_tensor_1d(ctx, a->type, 1);

    result->op     = GGML_OP_CROSS_ENTROPY_LOSS;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}